

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMath.c
# Opt level: O1

float deInt32ToFloatRoundToNegInf(deInt32 x)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  
  if (0x1fffffe < x + 0xffffffU) {
    uVar2 = -x;
    uVar4 = x;
    if (x < 1) {
      uVar4 = uVar2;
    }
    if (uVar4 == 0) {
      bVar3 = 0;
    }
    else {
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      bVar3 = (byte)iVar1 ^ 0x1f;
    }
    uVar4 = -1 << (8 - bVar3 & 0x1f);
    if (0 < x) {
      return (float)(int)(uVar4 & x);
    }
    if ((~uVar4 & uVar2) != 0) {
      return (float)(int)-(uVar4 & uVar2) - (float)(1 << (8 - bVar3 & 0x1f));
    }
  }
  return (float)x;
}

Assistant:

float deInt32ToFloatRoundToNegInf (deInt32 x)
{
	/* \note Sign bit is separate so the range is symmetric */
	if (x >= -0xFFFFFF && x <= 0xFFFFFF)
	{
		/* 24 bits are representable (23 mantissa + 1 implicit). */
		return (float)x;
	}
	else if (x != -0x7FFFFFFF - 1)
	{
		/* we are losing bits */
		const int		exponent	= 31 - deClz32((deUint32)deAbs32(x));
		const int		numLostBits	= exponent - 23;
		const deUint32	lostMask	= deBitMask32(0, numLostBits);

		DE_ASSERT(numLostBits > 0);

		if (x > 0)
		{
			/* Mask out lost bits to floor to a representable value */
			return (float)(deInt32)(~lostMask & (deUint32)x);
		}
		else if ((lostMask & (deUint32)-x) == 0u)
		{
			/* this was a representable value */
			DE_ASSERT( (deInt32)(float)x == x );
			return (float)x;
		}
		else
		{
			/* not representable, choose the next lower */
			const float nearestHigher	= (float)-(deInt32)(~lostMask & (deUint32)-x);
			const float oneUlp			= (float)(1u << (deUint32)numLostBits);
			const float nearestLower	= nearestHigher - oneUlp;

			/* check sanity */
			DE_ASSERT((deInt32)(float)nearestHigher > (deInt32)(float)nearestLower);

			return nearestLower;
		}
	}
	else
		return -(float)0x80000000u;
}